

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O0

void helics::valueExtract(defV *data,bool *val)

{
  string_view val_00;
  string_view val_01;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  long *plVar2;
  NamedPoint *pNVar3;
  int in_EDX;
  byte *in_RSI;
  int __x;
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  *in_RDI;
  double extraout_XMM0_Qa;
  double dVar4;
  __sv_type _Var5;
  string *str_1;
  NamedPoint *point;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *vec_1;
  vector<double,_std::allocator<double>_> *vec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  undefined7 in_stack_ffffffffffffff98;
  bool bVar6;
  char *in_stack_ffffffffffffffa8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffb0;
  
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
         ::index(in_RDI,(char *)in_RSI,in_EDX);
  switch(this) {
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0:
    __x = (int)in_RDI;
    std::
    get<double,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)0x2b9b55);
    std::abs(__x);
    *in_RSI = 0.0 < extraout_XMM0_Qa;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1:
  default:
    plVar2 = std::
             get<long,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                         *)0x2b9b83);
    *in_RSI = *plVar2 != 0;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2:
    std::
    get<std::__cxx11::string,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)0x2b9ba3);
    std::__cxx11::string::operator_cast_to_basic_string_view(this);
    val_00._M_str = in_stack_ffffffffffffffa8;
    val_00._M_len = (size_t)this;
    bVar1 = helicsBoolValue(val_00);
    *in_RSI = bVar1;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3:
    std::
    get<std::complex<double>,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)0x2b9be6);
    dVar4 = std::abs<double>((complex<double> *)this);
    *in_RSI = 0.0 < dVar4;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4:
    std::
    get<std::vector<double,std::allocator<double>>,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)0x2b9c11);
    dVar4 = vectorNorm(in_stack_ffffffffffffffb0);
    *in_RSI = dVar4 != 0.0;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5:
    std::
    get<std::vector<std::complex<double>,std::allocator<std::complex<double>>>,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)0x2b9c48);
    dVar4 = vectorNorm((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                       in_stack_ffffffffffffffb0);
    *in_RSI = dVar4 != 0.0;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6:
    pNVar3 = std::
             get<helics::NamedPoint,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                         *)0x2b9c7f);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2b9c98
                      );
    bVar6 = true;
    if (!bVar1) {
      _Var5 = std::__cxx11::string::operator_cast_to_basic_string_view(this);
      val_01._M_str = (char *)_Var5._M_len;
      val_01._M_len = (size_t)this;
      bVar6 = helicsBoolValue(val_01);
    }
    *in_RSI = bVar6;
    if ((((*in_RSI & 1) != 0) &&
        (((bVar1 = std::operator==(this,(char *)CONCAT17(bVar6,in_stack_ffffffffffffff98)), bVar1 ||
          (bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x2b9d03), bVar1)) && (pNVar3->value == 0.0)))) && (!NAN(pNVar3->value))) {
      *in_RSI = 0;
    }
  }
  return;
}

Assistant:

void valueExtract(const defV& data, bool& val)
{
    switch (data.index()) {
        case double_loc:  // double
            val = std::abs(std::get<double>(data)) > 0.0;
            break;
        case int_loc:  // int64_t
        default:
            val = (std::get<int64_t>(data) != 0);
            break;
        case string_loc:  // string
        {
            const auto& str = std::get<std::string>(data);
            val = helicsBoolValue(str);
            break;
        }
        case complex_loc:  // complex
            val = std::abs(std::get<std::complex<double>>(data)) > 0.0;
            break;
        case vector_loc:  // vector
        {
            const auto& vec = std::get<std::vector<double>>(data);
            val = vectorNorm(vec) != 0.0;
            break;
        }
        case complex_vector_loc: {
            const auto& vec = std::get<std::vector<std::complex<double>>>(data);
            val = vectorNorm(vec) != 0.0;
            break;
        }
        case named_point_loc: {
            const auto& point = std::get<NamedPoint>(data);
            const auto& str = point.name;
            val = str.empty() || helicsBoolValue(str);
            if (val) {
                if ((str == "value" || str.empty()) && point.value == 0.0) {
                    val = false;
                }
            }
        } break;
    }
}